

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  float fVar3;
  char cVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *draw_list;
  ImU32 IVar6;
  uint uVar7;
  ImGuiCol idx;
  int iVar8;
  ulong uVar9;
  ImGuiTableColumn *pIVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 local_80;
  undefined1 local_78 [16];
  int local_60;
  float local_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  pIVar5 = table->OuterWindow;
  fVar13 = (pIVar5->ClipRect).Max.y;
  pfVar1 = &(table->OuterRect).Min.y;
  if ((((*pfVar1 <= fVar13 && fVar13 != *pfVar1) &&
       (fVar13 = (table->OuterRect).Max.y, pfVar1 = &(pIVar5->ClipRect).Min.y,
       *pfVar1 <= fVar13 && fVar13 != *pfVar1)) &&
      (fVar13 = (pIVar5->ClipRect).Max.x,
      (table->OuterRect).Min.x <= fVar13 && fVar13 != (table->OuterRect).Min.x)) &&
     (fVar13 = (table->OuterRect).Max.x,
     (pIVar5->ClipRect).Min.x <= fVar13 && fVar13 != (pIVar5->ClipRect).Min.x)) {
    draw_list = table->InnerWindow->DrawList;
    ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,draw_list,0);
    ImDrawList::PushClipRect
              (draw_list,(table->Bg0ClipRectForDrawCmd).Min,(table->Bg0ClipRectForDrawCmd).Max,false
              );
    fVar13 = (table->InnerRect).Min.y;
    fVar3 = (table->InnerRect).Max.y;
    local_78 = ZEXT416((uint)fVar13);
    local_5c = fVar13;
    if (table->IsUsingHeaders == true) {
      fVar12 = fVar13;
      if (table->FreezeRowsCount < '\x01') {
        fVar12 = (table->WorkRect).Min.y;
      }
      fVar12 = fVar12 + table->LastFirstRowHeight;
      local_5c = fVar3;
      if (fVar12 <= fVar3) {
        local_5c = fVar12;
      }
    }
    if (((table->Flags & 0x200) != 0) && (0 < table->ColumnsCount)) {
      local_58 = (float)(int)fVar13;
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_60 = (int)fVar13 + 1;
      uVar9 = 0;
      do {
        if ((table->EnabledMaskByDisplayOrder >> (uVar9 & 0x3f) & 1) != 0) {
          cVar4 = (table->DisplayOrderToIndex).Data[uVar9];
          if (table->ResizedColumn == cVar4) {
            bVar11 = table->InstanceInteracted == table->InstanceCurrent;
          }
          else {
            bVar11 = false;
          }
          pIVar10 = (table->Columns).Data + cVar4;
          fVar13 = pIVar10->MaxX;
          pIVar2 = &(table->InnerClipRect).Max;
          if (((bool)((fVar13 < pIVar2->x || fVar13 == pIVar2->x) | bVar11)) &&
             ((((pIVar10->NextEnabledColumn != -1 || ((pIVar10->Flags & 0x40000010U) == 0)) ||
               ((table->Flags & 0x1e000U) == 0x4000)) && ((pIVar10->ClipRect).Min.x < fVar13)))) {
            fVar13 = fVar3;
            if (((table->FreezeColumnsCount == -1 ||
                 uVar9 + 1 != (ulong)(uint)(int)table->FreezeColumnsCount) && !bVar11) &&
                table->HoveredColumnBorder != cVar4) {
              bVar11 = (table->Flags & 0x1800) == 0;
              if (!bVar11) {
                fVar13 = local_5c;
              }
              IVar6 = table->RowBgColor[(ulong)bVar11 + 2];
            }
            else {
              if (bVar11) {
                idx = 0x1d;
              }
              else {
                if (table->HoveredColumnBorder != cVar4) {
                  IVar6 = table->BorderColorStrong;
                  goto LAB_0017bbeb;
                }
                idx = 0x1c;
              }
              IVar6 = GetColorU32(idx,1.0);
            }
LAB_0017bbeb:
            if (((float)local_78._0_4_ < fVar13) && (local_58 < fVar13)) {
              local_48._0_4_ = fVar13;
              fVar13 = local_58;
              iVar8 = local_60;
              do {
                local_80.x = pIVar10->MaxX + -0.1;
                local_80.y = fVar13;
                ImDrawList::AddText(draw_list,&local_80,IVar6,"|",(char *)0x0);
                fVar13 = (float)iVar8;
                iVar8 = iVar8 + 1;
              } while (fVar13 < (float)local_48._0_4_);
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < (long)table->ColumnsCount);
    }
    uVar7 = table->Flags & 0x500;
    if (uVar7 != 0) {
      fVar13 = (table->OuterRect).Min.x;
      fVar3 = (table->OuterRect).Min.y;
      fVar12 = (table->OuterRect).Max.x;
      local_58 = (table->OuterRect).Max.y;
      IVar6 = table->BorderColorStrong;
      local_78._0_4_ = fVar12;
      if (uVar7 == 0x500) {
        fVar14 = (float)(int)fVar3;
        if (fVar14 < local_58) {
          iVar8 = (int)fVar3;
          local_78._0_4_ = fVar12 + -2.0;
          do {
            iVar8 = iVar8 + 1;
            local_48 = ZEXT416((uint)fVar14);
            local_80.x = fVar13;
            local_80.y = fVar14;
            ImDrawList::AddText(draw_list,&local_80,IVar6,"|",(char *)0x0);
            local_80.x = (float)local_78._0_4_;
            local_80.y = (float)local_48._0_4_;
            ImDrawList::AddText(draw_list,&local_80,IVar6,"|",(char *)0x0);
            fVar14 = (float)iVar8;
          } while (fVar14 < local_58);
        }
      }
      else if ((((uint)table->Flags >> 10 & 1) != 0) &&
              (fVar14 = (float)(int)fVar3, fVar14 < local_58)) {
        iVar8 = (int)fVar3;
        local_78._0_4_ = fVar12 + -2.0;
        do {
          iVar8 = iVar8 + 1;
          local_48 = ZEXT416((uint)fVar14);
          local_80.x = fVar13;
          local_80.y = fVar14;
          ImDrawList::AddText(draw_list,&local_80,IVar6,"|",(char *)0x0);
          local_80.x = (float)local_78._0_4_;
          local_80.y = (float)local_48._0_4_;
          ImDrawList::AddText(draw_list,&local_80,IVar6,"|",(char *)0x0);
          fVar14 = (float)iVar8;
        } while (fVar14 < local_58);
      }
    }
    ImDrawList::PopClipRect(draw_list);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter.SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1) {
                //inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2 - 1.0f), col, 0.1f);
                for (int y = draw_y1; y < draw_y2; ++y) {
                    inner_drawlist->AddText(ImVec2(column->MaxX - 0.1f, y), col, "|");
                }
            }
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            for (int y = outer_border.Min.y; y < outer_border.Max.y; ++y) {
                inner_drawlist->AddText(ImVec2(outer_border.Min.x, y), outer_col, "|");
                inner_drawlist->AddText(ImVec2(outer_border.Max.x - 2.0f, y), outer_col, "|");
            }
            //inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            //inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH && false)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y && false)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}